

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O1

void __thiscall OpenMD::SSDAtomVisitor::SSDAtomVisitor(SSDAtomVisitor *this,SimInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_78;
  Vector3d local_58;
  Vector3d local_38;
  
  ReplacementVisitor::ReplacementVisitor(&this->super_ReplacementVisitor,info);
  (this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__ReplacementVisitor_002b9f58;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor.
                     visitorName,0,
             (char *)(this->super_ReplacementVisitor).super_BaseAtomVisitor.super_BaseVisitor.
                     visitorName._M_string_length,0x25b131);
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"SSD","");
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"SSD_E","");
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"SSD_RF","");
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"SSD1","");
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"SSDQ","");
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"SSDQO","");
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"TAP","");
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"TRED","");
  ReplacementVisitor::addReplacedAtomName(&this->super_ReplacementVisitor,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"H","");
  local_58.super_Vector<double,_3U>.data_[0] = 0.0;
  local_58.super_Vector<double,_3U>.data_[1] = -0.75695;
  local_58.super_Vector<double,_3U>.data_[2] = 0.5206;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"H","");
  local_58.super_Vector<double,_3U>.data_[0] = 0.0;
  local_58.super_Vector<double,_3U>.data_[1] = 0.75695;
  local_58.super_Vector<double,_3U>.data_[2] = 0.5206;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"O","");
  local_58.super_Vector<double,_3U>.data_[0] = 0.0;
  local_58.super_Vector<double,_3U>.data_[1] = 0.0;
  local_58.super_Vector<double,_3U>.data_[2] = -0.0654;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"X","");
  local_58.super_Vector<double,_3U>.data_[0] = 0.0;
  local_58.super_Vector<double,_3U>.data_[1] = 0.0;
  local_58.super_Vector<double,_3U>.data_[2] = 0.0;
  local_38.super_Vector<double,_3U>.data_[0] = 0.0;
  local_38.super_Vector<double,_3U>.data_[1] = 0.0;
  local_38.super_Vector<double,_3U>.data_[2] = 1.0;
  ReplacementVisitor::addSite(&this->super_ReplacementVisitor,&local_78,&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SSDAtomVisitor(SimInfo* info) : ReplacementVisitor(info) {
      visitorName = "SSDAtomVisitor";

      /// these are the atom names we can replace with a fixed structure
      addReplacedAtomName("SSD");
      addReplacedAtomName("SSD_E");
      addReplacedAtomName("SSD_RF");
      addReplacedAtomName("SSD1");
      addReplacedAtomName("SSDQ");
      addReplacedAtomName("SSDQO");
      addReplacedAtomName("TAP");
      addReplacedAtomName("TRED");

      // this is the reference structure we'll use for the replacement:
      addSite("H", Vector3d(0.0, -0.75695, 0.5206));
      addSite("H", Vector3d(0.0, 0.75695, 0.5206));
      addSite("O", Vector3d(0.0, 0.0, -0.0654));
      addSite("X", Vector3d(0.0, 0.0, 0.0), Vector3d(0, 0, 1));
    }